

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O1

void __thiscall Diligent::VAOCache::~VAOCache(VAOCache *this)

{
  string msg;
  string local_40;
  
  if ((this->m_Cache)._M_h._M_element_count != 0) {
    FormatString<char[58]>
              (&local_40,(char (*) [58])"VAO cache is not empty. Are there any unreleased objects?")
    ;
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"~VAOCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
               ,0x39);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_PSOToKey)._M_h._M_element_count != 0) {
    FormatString<char[27]>(&local_40,(char (*) [27])"PSOToKey hash is not empty");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"~VAOCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
               ,0x3a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_BuffToKey)._M_h._M_element_count != 0) {
    FormatString<char[28]>(&local_40,(char (*) [28])"BuffToKey hash is not empty");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"~VAOCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
               ,0x3b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>::~GLObjWrapper
            (&this->m_EmptyVAO);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_BuffToKey)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_PSOToKey)._M_h);
  std::
  _Hashtable<Diligent::VAOCache::VAOHashKey,_std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>,_std::allocator<std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::VAOCache::VAOHashKey>,_Diligent::VAOCache::VAOHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_Cache)._M_h);
  return;
}

Assistant:

VAOCache::~VAOCache()
{
    VERIFY(m_Cache.empty(), "VAO cache is not empty. Are there any unreleased objects?");
    VERIFY(m_PSOToKey.empty(), "PSOToKey hash is not empty");
    VERIFY(m_BuffToKey.empty(), "BuffToKey hash is not empty");
}